

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall kj::Exception::extendTrace(Exception *this,uint ignoreCount,uint limit)

{
  ulong uVar1;
  kj *this_00;
  uint ignoreCount_00;
  ulong uVar2;
  size_t elementCount;
  ArrayPtr<void_*const> AVar3;
  ArrayPtr<void_*> space;
  Array<void_*> newTraceSpace_heap;
  void *newTraceSpace_stack [40];
  kj *pkVar4;
  size_t sVar5;
  undefined8 *local_178;
  kj local_168 [328];
  
  if (this->isFullTrace == false) {
    uVar1 = 0x20;
    if (limit < 0x20) {
      uVar1 = (ulong)limit;
    }
    elementCount = uVar1 + ignoreCount + 1;
    if (uVar1 + ignoreCount < 0x28) {
      pkVar4 = (kj *)0x0;
      sVar5 = 0;
      local_178 = (undefined8 *)0x0;
      this_00 = local_168;
      ignoreCount_00 = ignoreCount;
    }
    else {
      ignoreCount_00 = 0;
      this_00 = (kj *)kj::_::HeapArrayDisposer::allocateImpl
                                (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
      local_178 = &kj::_::HeapArrayDisposer::instance;
      pkVar4 = this_00;
      sVar5 = elementCount;
    }
    space.size_._0_4_ = ignoreCount + 1;
    space.ptr = (void **)elementCount;
    space.size_._4_4_ = 0;
    AVar3 = getStackTrace(this_00,space,ignoreCount_00);
    uVar1 = AVar3.size_;
    if (ignoreCount + 2 < uVar1) {
      uVar2 = 0x20 - (ulong)this->traceCount;
      if (uVar1 <= uVar2) {
        uVar2 = uVar1;
      }
      memcpy(this->trace + this->traceCount,AVar3.ptr,uVar2 * 8);
      this->traceCount = this->traceCount + (int)uVar2;
      this->isFullTrace = true;
    }
    if (pkVar4 != (kj *)0x0) {
      (**(code **)*local_178)(local_178,pkVar4,8,sVar5,sVar5,0,0,0);
    }
  }
  return;
}

Assistant:

void Exception::extendTrace(uint ignoreCount, uint limit) {
  if (isFullTrace) {
    // Awkward: extendTrace() was called twice without truncating in between. This should probably
    // be an error, but historically we didn't check for this so I'm hesitant to make it an error
    // now. We shouldn't actually extend the trace, though, as our current trace is presumably
    // rooted in main() and it'd be weird to append frames "above" that.
    // TODO(cleanup): Abort here and see what breaks?
    return;
  }

  KJ_STACK_ARRAY(void*, newTraceSpace, kj::min(kj::size(trace), limit) + ignoreCount + 1,
      sizeof(trace)/sizeof(trace[0]) + 8, 128);

  auto newTrace = kj::getStackTrace(newTraceSpace, ignoreCount + 1);
  if (newTrace.size() > ignoreCount + 2) {
    // Remove suffix that won't fit into our static-sized trace.
    newTrace = newTrace.first(kj::min(kj::size(trace) - traceCount, newTrace.size()));

    // Copy the rest into our trace.
    memcpy(trace + traceCount, newTrace.begin(), newTrace.asBytes().size());
    traceCount += newTrace.size();
    isFullTrace = true;
  }
}